

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  U32 *src;
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  U32 *headerBuffer;
  U32 *pUVar7;
  ulong srcSize;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  uint matchlengthMaxValue;
  uint maxSymbolValue;
  short offcodeNCount [32];
  uint local_10c;
  uint local_108;
  uint local_104;
  ulong local_100;
  ZSTD_matchState_t *local_f8;
  ZSTD_CCtx_params *local_f0;
  uint local_e8 [28];
  short local_78 [36];
  
  if (dictSize < 9 || dict == (void *)0x0) {
    return 0;
  }
  bs->rep[0] = 1;
  bs->rep[1] = 4;
  bs->rep[2] = 8;
  (bs->entropy).huf.repeatMode = HUF_repeat_none;
  (bs->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  if (dictContentType == ZSTD_dct_rawContent) {
LAB_0010fd20:
    ZSTD_loadDictionaryContent(ms,params,dict,dictSize,dtlm);
    return 0;
  }
  if (*dict != -0x13cf5bc9) {
    if (dictContentType == ZSTD_dct_fullDict) {
      return 0xffffffffffffffe0;
    }
    if (dictContentType == ZSTD_dct_auto) goto LAB_0010fd20;
  }
  local_108 = 0x1f;
  if ((params->fParams).noDictIDFlag == 0) {
    local_100 = (ulong)*(uint *)((long)dict + 4);
  }
  else {
    local_100 = 0;
  }
  local_e8[0] = 0xff;
  local_f8 = ms;
  local_f0 = params;
  sVar3 = HUF_readCTable((HUF_CElt *)bs,local_e8,(void *)((long)dict + 8),dictSize - 8);
  if (local_e8[0] < 0xff || 0xffffffffffffff88 < sVar3) {
    return 0xffffffffffffffe2;
  }
  pUVar7 = (U32 *)(dictSize + (long)dict);
  headerBuffer = (U32 *)((long)dict + sVar3 + 8);
  sVar3 = FSE_readNCount(local_78,&local_108,local_e8,headerBuffer,(long)pUVar7 - (long)headerBuffer
                        );
  if ((sVar3 < 0xffffffffffffff89) && (local_e8[0] < 9)) {
    sVar4 = FSE_buildCTable_wksp
                      ((bs->entropy).fse.offcodeCTable,local_78,0x1f,local_e8[0],workspace,0x1800);
    bVar12 = sVar4 < 0xffffffffffffff89;
    sVar4 = 0;
    if (bVar12) {
      sVar4 = sVar3;
    }
    headerBuffer = (U32 *)((long)headerBuffer + sVar4);
  }
  else {
    bVar12 = false;
  }
  if (!bVar12) {
    return 0xffffffffffffffe2;
  }
  local_10c = 0x34;
  sVar3 = FSE_readNCount((short *)local_e8,&local_10c,&local_104,headerBuffer,
                         (long)pUVar7 - (long)headerBuffer);
  if (local_104 < 10 && sVar3 < 0xffffffffffffff89) {
    if (local_10c < 0x34) {
      bVar12 = false;
LAB_0010feb5:
      uVar11 = 0xffffffffffffffe2;
    }
    else {
      uVar11 = 0;
      lVar9 = 0;
      do {
        bVar12 = local_78[lVar9 + -0x38] != 0;
        if (local_78[lVar9 + -0x38] == 0) goto LAB_0010feb5;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x35);
      bVar12 = true;
    }
    if (!bVar12) goto LAB_0010ff11;
    uVar11 = 0xffffffffffffffe2;
    sVar4 = FSE_buildCTable_wksp
                      ((bs->entropy).fse.matchlengthCTable,(short *)local_e8,local_10c,local_104,
                       workspace,0x1800);
    if (0xffffffffffffff88 < sVar4) goto LAB_0010fe9a;
    headerBuffer = (U32 *)((long)headerBuffer + sVar3);
    bVar12 = true;
  }
  else {
LAB_0010fe9a:
    uVar11 = 0xffffffffffffffe2;
LAB_0010ff11:
    bVar12 = false;
  }
  if (!bVar12) {
    return uVar11;
  }
  local_10c = 0x23;
  sVar3 = FSE_readNCount((short *)local_e8,&local_10c,&local_104,headerBuffer,
                         (long)pUVar7 - (long)headerBuffer);
  if (local_104 < 10 && sVar3 < 0xffffffffffffff89) {
    uVar8 = 0xffffffffffffffe2;
    if (local_10c < 0x23) {
      bVar12 = false;
    }
    else {
      lVar9 = 0;
      do {
        bVar12 = local_78[lVar9 + -0x38] != 0;
        if (local_78[lVar9 + -0x38] == 0) goto LAB_0010ff8f;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x24);
      bVar12 = true;
      uVar8 = 0;
    }
LAB_0010ff8f:
    if (bVar12) {
      sVar4 = FSE_buildCTable_wksp
                        ((bs->entropy).fse.litlengthCTable,(short *)local_e8,local_10c,local_104,
                         workspace,0x1800);
      if (sVar4 < 0xffffffffffffff89) {
        headerBuffer = (U32 *)((long)headerBuffer + sVar3);
        bVar12 = true;
        goto LAB_0010ffc6;
      }
      goto LAB_0010ff58;
    }
  }
  else {
LAB_0010ff58:
    uVar8 = 0xffffffffffffffe2;
  }
  bVar12 = false;
  uVar11 = uVar8;
LAB_0010ffc6:
  uVar8 = uVar11;
  if (bVar12) {
    src = headerBuffer + 3;
    uVar8 = 0xffffffffffffffe2;
    if (src <= pUVar7) {
      bs->rep[0] = *headerBuffer;
      bs->rep[1] = headerBuffer[1];
      srcSize = (long)pUVar7 - (long)src;
      uVar6 = (int)srcSize + 0x20000;
      uVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar6 = 0x1f;
      if (srcSize >> 0x11 < 0x7fff) {
        uVar6 = uVar1;
      }
      bs->rep[2] = headerBuffer[2];
      if (local_108 < uVar6) {
        bVar12 = false;
      }
      else {
        uVar5 = 0;
        do {
          bVar12 = local_78[uVar5] != 0;
          if (local_78[uVar5] == 0) goto LAB_0011005f;
          uVar5 = uVar5 + 1;
        } while (uVar6 + 1 != uVar5);
        bVar12 = true;
        uVar8 = 0;
      }
LAB_0011005f:
      if (bVar12) {
        uVar5 = 0xffffffffffffffe2;
        uVar8 = uVar5;
        bVar12 = false;
        if (((ulong)bs->rep[0] != 0) && (bVar12 = false, bs->rep[0] <= srcSize)) {
          uVar2 = 0;
          do {
            uVar10 = uVar2;
            uVar8 = uVar11;
            if ((uVar10 == 2) || (uVar8 = uVar5, (ulong)bs->rep[uVar10 + 1] == 0)) break;
            uVar2 = uVar10 + 1;
          } while (bs->rep[uVar10 + 1] <= srcSize);
          bVar12 = 1 < uVar10;
        }
        if (bVar12) {
          (bs->entropy).huf.repeatMode = HUF_repeat_valid;
          (bs->entropy).fse.offcode_repeatMode = FSE_repeat_valid;
          (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_valid;
          (bs->entropy).fse.litlength_repeatMode = FSE_repeat_valid;
          ZSTD_loadDictionaryContent(local_f8,local_f0,src,srcSize,dtlm);
          uVar8 = local_100;
        }
      }
    }
  }
  return uVar8;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<=8)) return 0;

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);
        }
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(bs, ms, params, dict, dictSize, dtlm, workspace);
}